

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::
ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
                *this,int opcode)

{
  TestNLHandler2 *pTVar1;
  int iVar2;
  OpCodeInfo *pOVar3;
  BinaryReaderBase *this_00;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2> *in_RDI;
  PairwiseArgHandler args_3;
  int num_args_1;
  LogicalArgHandler args_2;
  int num_args;
  LogicalExpr else_expr;
  LogicalExpr then_expr;
  LogicalExpr condition;
  char c;
  NumericExpr lhs;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::NumericExprReader>
  args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::LogicalExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
  *in_stack_ffffffffffffff68;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
  *in_stack_ffffffffffffff70;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2> *this_01;
  int in_stack_ffffffffffffff7c;
  Kind KVar4;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
  *in_stack_ffffffffffffff80;
  CStringRef in_stack_ffffffffffffffa0;
  BasicCStringRef<char> local_38;
  char local_2c;
  Kind local_1c;
  OpCodeInfo *local_18;
  
  local_18 = GetOpCodeInfo((int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  local_1c = local_18->kind;
  this_00 = (BinaryReaderBase *)(ulong)(local_18->first_kind - NOT);
  switch(this_00) {
  case (BinaryReaderBase *)0x0:
    pTVar1 = in_RDI->handler_;
    ReadLogicalExpr(in_RDI);
    TestNLHandler2::OnNot(pTVar1);
    break;
  case (BinaryReaderBase *)0x1:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::LogicalExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::LogicalExprReader>
                       *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    TestNLHandler2::OnBinaryLogical(in_RDI->handler_,local_1c);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffa0,
               "expected logical expression opcode");
    BinaryReaderBase::ReportError<>(this_00,in_stack_ffffffffffffffa0);
    break;
  case (BinaryReaderBase *)0x4:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::NumericExprReader>
                       *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    TestNLHandler2::OnRelational(in_RDI->handler_,local_1c);
    break;
  case (BinaryReaderBase *)0xa:
    ReadNumericExpr(in_stack_ffffffffffffff70,SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
    local_2c = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
    if (local_2c == 'o') {
      ReadOpCode(in_stack_ffffffffffffff80);
      pOVar3 = GetOpCodeInfo((int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      if (pOVar3->kind != COUNT) goto LAB_0020d5b3;
    }
    else {
LAB_0020d5b3:
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_38,"expected count expression");
      BinaryReaderBase::ReportError<>(this_00,in_stack_ffffffffffffffa0);
    }
    this_01 = (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
               *)in_RDI->handler_;
    KVar4 = local_1c;
    ReadCountExpr(this_01);
    TestNLHandler2::OnLogicalCount((TestNLHandler2 *)this_01,KVar4);
    break;
  case (BinaryReaderBase *)0x10:
    ReadLogicalExpr(in_RDI);
    ReadLogicalExpr(in_RDI);
    ReadLogicalExpr(in_RDI);
    TestNLHandler2::OnImplication(in_RDI->handler_);
    break;
  case (BinaryReaderBase *)0x11:
    iVar2 = ReadNumArgs(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    TestNLHandler2::BeginIteratedLogical(in_RDI->handler_,local_1c,iVar2);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::LogicalExprReader,TestNLHandler2::LogicalArgHandler>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               (LogicalArgHandler *)in_stack_ffffffffffffff70);
    TestNLHandler2::EndIteratedLogical(in_RDI->handler_);
    break;
  case (BinaryReaderBase *)0x13:
    iVar2 = ReadNumArgs(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    TestNLHandler2::BeginPairwise(in_RDI->handler_,local_1c,iVar2);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::NumericExprReader,TestNLHandler2::PairwiseArgHandler>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               (PairwiseArgHandler *)in_stack_ffffffffffffff70);
    TestNLHandler2::EndPairwise(in_RDI->handler_);
  }
  return;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}